

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              char **ptr)

{
  int iVar1;
  undefined1 *puVar2;
  char *pcVar3;
  int slop;
  int numbytes;
  int length;
  int exists;
  xnvCtrlQueryStringAttributeReq *req;
  xnvCtrlQueryStringAttributeReply rep;
  XExtDisplayInfo *info;
  char **ptr_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  attribute_local = target_id;
  display_mask_local = target_type;
  _target_id_local = dpy;
  rep._24_8_ = find_display(dpy);
  if (ptr == (char **)0x0) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if (((XExtDisplayInfo *)rep._24_8_ == (XExtDisplayInfo *)0x0) ||
          (((XExtDisplayInfo *)rep._24_8_)->codes == (XExtCodes *)0x0)) {
    XMissingExtension(_target_id_local,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    XNVCTRLCheckTargetData
              (_target_id_local,(XExtDisplayInfo *)rep._24_8_,(int *)&display_mask_local,
               (int *)&attribute_local);
    if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
      (*_target_id_local->lock_fns->lock_display)(_target_id_local);
    }
    puVar2 = (undefined1 *)_XGetRequest(_target_id_local,4,0x10);
    *puVar2 = (char)*(undefined4 *)(*(long *)(rep._24_8_ + 0x10) + 4);
    puVar2[1] = 4;
    *(short *)(puVar2 + 6) = (short)display_mask_local;
    *(short *)(puVar2 + 4) = (short)attribute_local;
    *(uint *)(puVar2 + 8) = display_mask;
    *(uint *)(puVar2 + 0xc) = attribute;
    iVar1 = _XReply(_target_id_local,&req,0);
    if (iVar1 == 0) {
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
      }
      if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*_target_id_local->synchandler)(_target_id_local);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      pcVar3 = (char *)malloc((long)(int)rep.length);
      *ptr = pcVar3;
      if (*ptr == (char *)0x0) {
        _XEatData(_target_id_local,(long)req._4_4_);
        if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
          (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
        }
        if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
          (*_target_id_local->synchandler)(_target_id_local);
        }
        dpy_local._4_4_ = 0;
      }
      else {
        _XRead(_target_id_local,*ptr,(long)(int)rep.length);
        if ((rep.length & 3) != 0) {
          _XEatData(_target_id_local,(long)(int)(4 - (rep.length & 3)));
        }
        if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
          (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
        }
        if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
          (*_target_id_local->synchandler)(_target_id_local);
        }
        dpy_local._4_1_ = rep.type;
        dpy_local._5_1_ = rep.pad0;
        dpy_local._6_2_ = rep.sequenceNumber;
      }
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLQueryTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char **ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryStringAttributeReply rep;
    xnvCtrlQueryStringAttributeReq   *req;
    Bool exists;
    int length, numbytes, slop;

    if (!ptr) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    length = rep.length;
    numbytes = rep.n;
    slop = numbytes & 3;
    *ptr = (char *) Xmalloc(numbytes);
    if (! *ptr) {
        _XEatData(dpy, length);
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    } else {
        _XRead(dpy, (char *) *ptr, numbytes);
        if (slop) _XEatData(dpy, 4-slop);
    }
    exists = rep.flags;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}